

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void detachFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  uint uVar1;
  sqlite3 *db;
  Btree *p;
  Db *pDVar2;
  int iVar3;
  char *pcVar4;
  Db *pDVar5;
  ulong uVar6;
  ulong uVar7;
  char *zRight;
  ulong uVar8;
  long in_FS_OFFSET;
  bool bVar9;
  bool bVar10;
  char zErr [128];
  char local_b8 [128];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar4 = (char *)sqlite3ValueText(*argv,'\x01');
  zRight = "";
  if (pcVar4 != (char *)0x0) {
    zRight = pcVar4;
  }
  db = context->pOut->db;
  uVar1 = db->nDb;
  uVar8 = (ulong)uVar1;
  bVar9 = 0 < (int)uVar1;
  if ((int)uVar1 < 1) {
    pDVar5 = (Db *)0x0;
    bVar10 = true;
  }
  else {
    uVar6 = 0;
    pDVar2 = db->aDb;
    do {
      pDVar5 = pDVar2;
      if ((pDVar5->pBt != (Btree *)0x0) &&
         (iVar3 = sqlite3StrICmp(pDVar5->zDbSName,zRight), uVar7 = uVar6, iVar3 == 0)) break;
      uVar6 = uVar6 + 1;
      bVar9 = uVar6 < uVar8;
      pDVar2 = pDVar5 + 1;
      uVar7 = uVar8;
    } while (uVar8 != uVar6);
    bVar10 = (uint)uVar7 < 2;
  }
  if (bVar9) {
    if (bVar10) {
      pcVar4 = "cannot detach database %s";
      goto LAB_00256001;
    }
    if (db->autoCommit != '\0') {
      p = pDVar5->pBt;
      if ((p->inTrans == '\0') && (p->nBackup == 0)) {
        sqlite3BtreeClose(p);
        pDVar5->pBt = (Btree *)0x0;
        pDVar5->pSchema = (Schema *)0x0;
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          sqlite3CollapseDatabaseArray(db);
          return;
        }
        goto LAB_002560ba;
      }
      pcVar4 = "database %s is locked";
      goto LAB_00256001;
    }
    sqlite3_snprintf(0x80,local_b8,"cannot DETACH database within transaction");
  }
  else {
    pcVar4 = "no such database: %s";
LAB_00256001:
    sqlite3_snprintf(0x80,local_b8,pcVar4,zRight);
  }
  context->isError = 1;
  context->fErrorOrAux = '\x01';
  sqlite3VdbeMemSetStr(context->pOut,local_b8,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_002560ba:
  __stack_chk_fail();
}

Assistant:

static void detachFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  const char *zName = (const char *)sqlite3_value_text(argv[0]);
  sqlite3 *db = sqlite3_context_db_handle(context);
  int i;
  Db *pDb = 0;
  char zErr[128];

  UNUSED_PARAMETER(NotUsed);

  if( zName==0 ) zName = "";
  for(i=0; i<db->nDb; i++){
    pDb = &db->aDb[i];
    if( pDb->pBt==0 ) continue;
    if( sqlite3StrICmp(pDb->zDbSName, zName)==0 ) break;
  }

  if( i>=db->nDb ){
    sqlite3_snprintf(sizeof(zErr),zErr, "no such database: %s", zName);
    goto detach_error;
  }
  if( i<2 ){
    sqlite3_snprintf(sizeof(zErr),zErr, "cannot detach database %s", zName);
    goto detach_error;
  }
  if( !db->autoCommit ){
    sqlite3_snprintf(sizeof(zErr), zErr,
                     "cannot DETACH database within transaction");
    goto detach_error;
  }
  if( sqlite3BtreeIsInReadTrans(pDb->pBt) || sqlite3BtreeIsInBackup(pDb->pBt) ){
    sqlite3_snprintf(sizeof(zErr),zErr, "database %s is locked", zName);
    goto detach_error;
  }

  sqlite3BtreeClose(pDb->pBt);
  pDb->pBt = 0;
  pDb->pSchema = 0;
  sqlite3CollapseDatabaseArray(db);
  return;

detach_error:
  sqlite3_result_error(context, zErr, -1);
}